

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plugin.h
# Opt level: O1

callback<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
 __thiscall
cppcms::plugin::manager::entry<std::__cxx11::string(std::__cxx11::string_const&)>
          (manager *this,string *plugin_name,string *entry_name)

{
  string *psVar1;
  code *pcVar2;
  runtime_error *prVar3;
  signature_error *this_00;
  long *plVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RCX;
  size_type *psVar5;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar6;
  pointer_type ptr;
  refcounted_ptr call;
  string local_120;
  intrusive_ptr<booster::callable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>_>
  local_100;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  long local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  psVar1 = (string *)cppcms::plugin::manager::instance();
  pcVar2 = (code *)cppcms::plugin::manager::get_entry(psVar1,(string *)entry_name);
  if (pcVar2 == (code *)0x0) {
    prVar3 = (runtime_error *)__cxa_allocate_exception(0x30);
    std::operator+(&local_d0,"Could not find entry `",in_RCX);
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_d0);
    local_f8._M_dataplus._M_p = (pointer)*plVar4;
    psVar5 = (size_type *)(plVar4 + 2);
    if ((size_type *)local_f8._M_dataplus._M_p == psVar5) {
      local_f8.field_2._M_allocated_capacity = *psVar5;
      local_f8.field_2._8_8_ = plVar4[3];
      local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
    }
    else {
      local_f8.field_2._M_allocated_capacity = *psVar5;
    }
    local_f8._M_string_length = plVar4[1];
    *plVar4 = (long)psVar5;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    std::operator+(&local_b0,&local_f8,entry_name);
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_b0);
    local_120._M_dataplus._M_p = (pointer)*plVar4;
    paVar6 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)(plVar4 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_120._M_dataplus._M_p == paVar6) {
      local_120.field_2._M_allocated_capacity = paVar6->_M_allocated_capacity;
      local_120.field_2._8_8_ = plVar4[3];
      local_120._M_dataplus._M_p = (pointer)&local_120.field_2;
    }
    else {
      local_120.field_2._M_allocated_capacity = paVar6->_M_allocated_capacity;
    }
    local_120._M_string_length = plVar4[1];
    *plVar4 = (long)paVar6;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    booster::runtime_error::runtime_error(prVar3,&local_120);
    *(undefined ***)prVar3 = &PTR__runtime_error_0010fbb0;
    (prVar3->super_backtrace)._vptr_backtrace = (_func_int **)&PTR__cppcms_error_0010fbd8;
    __cxa_throw(prVar3,&cppcms_error::typeinfo,booster::runtime_error::~runtime_error);
  }
  (*pcVar2)(&local_d8);
  if (local_d8 != 0) {
    local_120._M_dataplus._M_p =
         (pointer)__dynamic_cast(local_d8,&booster::refcounted::typeinfo,
                                 &booster::
                                  callable<std::__cxx11::string(std::__cxx11::string_const&)>::
                                  typeinfo,0);
    if ((callable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
         *)local_120._M_dataplus._M_p !=
        (callable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
         *)0x0) {
      booster::atomic_counter::inc();
      local_100.p_ = (callable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                      *)local_120._M_dataplus._M_p;
      if ((callable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
           *)local_120._M_dataplus._M_p !=
          (callable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
           *)0x0) {
        booster::atomic_counter::inc();
      }
      *(callable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
        **)this = local_100.p_;
      if (local_100.p_ !=
          (callable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
           *)0x0) {
        booster::atomic_counter::inc();
      }
      booster::
      intrusive_ptr<booster::callable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>_>
      ::~intrusive_ptr(&local_100);
      booster::
      intrusive_ptr<booster::callable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>_>
      ::~intrusive_ptr((intrusive_ptr<booster::callable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>_>
                        *)&local_120);
      booster::intrusive_ptr<booster::refcounted>::~intrusive_ptr
                ((intrusive_ptr<booster::refcounted> *)&local_d8);
      return (callback<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
              )(pointer_type)this;
    }
    this_00 = (signature_error *)__cxa_allocate_exception(0x48);
    std::operator+(&local_50,"Invalid signature request in plugin `",entry_name);
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_50);
    local_90._M_dataplus._M_p = (pointer)*plVar4;
    psVar5 = (size_type *)(plVar4 + 2);
    if ((size_type *)local_90._M_dataplus._M_p == psVar5) {
      local_90.field_2._M_allocated_capacity = *psVar5;
      local_90.field_2._8_8_ = plVar4[3];
      local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
    }
    else {
      local_90.field_2._M_allocated_capacity = *psVar5;
    }
    local_90._M_string_length = plVar4[1];
    *plVar4 = (long)psVar5;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    std::operator+(&local_d0,&local_90,in_RCX);
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_d0);
    local_f8._M_dataplus._M_p = (pointer)*plVar4;
    psVar5 = (size_type *)(plVar4 + 2);
    if ((size_type *)local_f8._M_dataplus._M_p == psVar5) {
      local_f8.field_2._M_allocated_capacity = *psVar5;
      local_f8.field_2._8_8_ = plVar4[3];
      local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
    }
    else {
      local_f8.field_2._M_allocated_capacity = *psVar5;
    }
    local_f8._M_string_length = plVar4[1];
    *plVar4 = (long)psVar5;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    psVar1 = (string *)cppcms::plugin::manager::instance();
    cppcms::plugin::manager::signature((string *)&local_70,psVar1);
    std::operator+(&local_b0,&local_f8,&local_70);
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_b0);
    local_120._M_dataplus._M_p = (pointer)*plVar4;
    paVar6 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)(plVar4 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_120._M_dataplus._M_p == paVar6) {
      local_120.field_2._M_allocated_capacity = paVar6->_M_allocated_capacity;
      local_120.field_2._8_8_ = plVar4[3];
      local_120._M_dataplus._M_p = (pointer)&local_120.field_2;
    }
    else {
      local_120.field_2._M_allocated_capacity = paVar6->_M_allocated_capacity;
    }
    local_120._M_string_length = plVar4[1];
    *plVar4 = (long)paVar6;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    cppcms::plugin::signature_error::signature_error(this_00,(string *)&local_120);
    __cxa_throw(this_00,&signature_error::typeinfo,cppcms::plugin::signature_error::~signature_error
               );
  }
  prVar3 = (runtime_error *)__cxa_allocate_exception(0x30);
  std::operator+(&local_d0,"Failed to create callback from plugin `",entry_name);
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_d0);
  local_f8._M_dataplus._M_p = (pointer)*plVar4;
  psVar5 = (size_type *)(plVar4 + 2);
  if ((size_type *)local_f8._M_dataplus._M_p == psVar5) {
    local_f8.field_2._M_allocated_capacity = *psVar5;
    local_f8.field_2._8_8_ = plVar4[3];
    local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
  }
  else {
    local_f8.field_2._M_allocated_capacity = *psVar5;
  }
  local_f8._M_string_length = plVar4[1];
  *plVar4 = (long)psVar5;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  std::operator+(&local_b0,&local_f8,in_RCX);
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_b0);
  local_120._M_dataplus._M_p = (pointer)*plVar4;
  paVar6 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)(plVar4 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_120._M_dataplus._M_p == paVar6) {
    local_120.field_2._M_allocated_capacity = paVar6->_M_allocated_capacity;
    local_120.field_2._8_8_ = plVar4[3];
    local_120._M_dataplus._M_p = (pointer)&local_120.field_2;
  }
  else {
    local_120.field_2._M_allocated_capacity = paVar6->_M_allocated_capacity;
  }
  local_120._M_string_length = plVar4[1];
  *plVar4 = (long)paVar6;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  booster::runtime_error::runtime_error(prVar3,&local_120);
  *(undefined ***)prVar3 = &PTR__runtime_error_0010fbb0;
  (prVar3->super_backtrace)._vptr_backtrace = (_func_int **)&PTR__cppcms_error_0010fbd8;
  __cxa_throw(prVar3,&cppcms_error::typeinfo,booster::runtime_error::~runtime_error);
}

Assistant:

booster::callback<Signature>
	entry(std::string const &plugin_name,std::string const &entry_name)
	{
		typedef booster::callback<Signature> callback_type;
		typedef typename callback_type::callable_type callable_type;
		typedef typename callback_type::pointer_type pointer_type;

		entry_point_type plugin_call = instance().get_entry(plugin_name,entry_name);
		if(!plugin_call)
			throw cppcms_error("Could not find entry `" + entry_name + "' in plugin `" + plugin_name + "'");
		refcounted_ptr call = plugin_call();
		if(!call)
			throw cppcms_error("Failed to create callback from plugin `"+plugin_name+"':entry `" + entry_name + "'");

		callable_type *real_call = dynamic_cast<callable_type *>(call.get());
		if(!real_call) {
			throw signature_error("Invalid signature request in plugin `"+ plugin_name +"':entry `"+entry_name+"', expected following signaure `" + instance().signature(plugin_name,entry_name) + "'");
		}
		pointer_type ptr(real_call);
		callback_type result(ptr);
		return result;
	}